

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter_enc.c
# Opt level: O0

void VP8StoreFilterStats(VP8EncIterator *it)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  double *pdVar7;
  long lVar8;
  long in_RDI;
  double dVar9;
  VP8EncIterator *unaff_retaddr;
  int level;
  int step_size;
  int delta_max;
  int delta_min;
  int level0;
  int s;
  VP8Encoder *enc;
  int d;
  uint8_t *yuv2;
  undefined4 in_stack_fffffffffffffff0;
  undefined4 in_stack_fffffffffffffff4;
  
  yuv2 = *(uint8_t **)(in_RDI + 0x28);
  uVar3 = (uint)(**(byte **)(in_RDI + 0x30) >> 5 & 3);
  iVar1 = *(int *)(yuv2 + (long)(int)uVar3 * 0x2e8 + 0x50c);
  iVar6 = -*(int *)(yuv2 + (long)(int)uVar3 * 0x2e8 + 0x508);
  iVar2 = *(int *)(yuv2 + (long)(int)uVar3 * 0x2e8 + 0x508);
  iVar4 = 1;
  if (3 < iVar2 + *(int *)(yuv2 + (long)(int)uVar3 * 0x2e8 + 0x508)) {
    iVar4 = 4;
  }
  if ((*(long *)(in_RDI + 0x140) != 0) &&
     (((**(byte **)(in_RDI + 0x30) & 3) != 1 || ((**(byte **)(in_RDI + 0x30) >> 4 & 1) == 0)))) {
    dVar9 = GetMBSSIM((uint8_t *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0),yuv2)
    ;
    pdVar7 = (double *)(*(long *)(in_RDI + 0x140) + (long)(int)uVar3 * 0x200);
    *pdVar7 = dVar9 + *pdVar7;
    for (; iVar6 <= iVar2; iVar6 = iVar4 + iVar6) {
      iVar5 = iVar1 + iVar6;
      if ((0 < iVar5) && (iVar5 < 0x40)) {
        DoFilter(unaff_retaddr,(int)((ulong)in_RDI >> 0x20));
        dVar9 = GetMBSSIM((uint8_t *)CONCAT44(iVar6,in_stack_fffffffffffffff0),yuv2);
        lVar8 = *(long *)(in_RDI + 0x140) + (long)(int)uVar3 * 0x200;
        *(double *)(lVar8 + (long)iVar5 * 8) = dVar9 + *(double *)(lVar8 + (long)iVar5 * 8);
      }
    }
  }
  return;
}

Assistant:

void VP8StoreFilterStats(VP8EncIterator* const it) {
#if !defined(WEBP_REDUCE_SIZE)
  int d;
  VP8Encoder* const enc = it->enc_;
  const int s = it->mb_->segment_;
  const int level0 = enc->dqm_[s].fstrength_;

  // explore +/-quant range of values around level0
  const int delta_min = -enc->dqm_[s].quant_;
  const int delta_max = enc->dqm_[s].quant_;
  const int step_size = (delta_max - delta_min >= 4) ? 4 : 1;

  if (it->lf_stats_ == NULL) return;

  // NOTE: Currently we are applying filter only across the sublock edges
  // There are two reasons for that.
  // 1. Applying filter on macro block edges will change the pixels in
  // the left and top macro blocks. That will be hard to restore
  // 2. Macro Blocks on the bottom and right are not yet compressed. So we
  // cannot apply filter on the right and bottom macro block edges.
  if (it->mb_->type_ == 1 && it->mb_->skip_) return;

  // Always try filter level  zero
  (*it->lf_stats_)[s][0] += GetMBSSIM(it->yuv_in_, it->yuv_out_);

  for (d = delta_min; d <= delta_max; d += step_size) {
    const int level = level0 + d;
    if (level <= 0 || level >= MAX_LF_LEVELS) {
      continue;
    }
    DoFilter(it, level);
    (*it->lf_stats_)[s][level] += GetMBSSIM(it->yuv_in_, it->yuv_out2_);
  }
#else  // defined(WEBP_REDUCE_SIZE)
  (void)it;
#endif  // !defined(WEBP_REDUCE_SIZE)
}